

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprLexer.cxx
# Opt level: O3

void cmExpr_yyrestart(FILE *input_file,yyscan_t yyscanner)

{
  undefined1 *puVar1;
  YY_BUFFER_STATE pyVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = *(long *)((long)yyscanner + 0x28);
  if ((lVar3 == 0) || (lVar4 = *(long *)((long)yyscanner + 0x18), *(long *)(lVar3 + lVar4 * 8) == 0)
     ) {
    cmExpr_yyensure_buffer_stack(yyscanner);
    pyVar2 = cmExpr_yy_create_buffer(*(FILE **)((long)yyscanner + 8),0x4000,yyscanner);
    lVar4 = *(long *)((long)yyscanner + 0x18);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x28) + lVar4 * 8) = pyVar2;
    lVar3 = *(long *)((long)yyscanner + 0x28);
    if (lVar3 == 0) {
      pyVar2 = (YY_BUFFER_STATE)0x0;
      goto LAB_00540afb;
    }
  }
  pyVar2 = *(YY_BUFFER_STATE *)(lVar3 + lVar4 * 8);
LAB_00540afb:
  cmExpr_yy_init_buffer(pyVar2,input_file,yyscanner);
  lVar3 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  *(undefined4 *)((long)yyscanner + 0x34) = *(undefined4 *)(lVar3 + 0x1c);
  puVar1 = *(undefined1 **)(lVar3 + 0x10);
  *(undefined1 **)((long)yyscanner + 0x40) = puVar1;
  *(undefined1 **)((long)yyscanner + 0x80) = puVar1;
  *(undefined8 *)((long)yyscanner + 8) =
       **(undefined8 **)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  *(undefined1 *)((long)yyscanner + 0x30) = *puVar1;
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}